

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_1::createTextureTests(TestCaseGroup *textureTests)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  
  testCtx = (textureTests->super_TestNode).m_testCtx;
  pTVar1 = &createTextureFilteringTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureMipmappingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createExplicitLodTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureShadowTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createFilteringAnisotropyTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureCompressedFormatTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createTextureTests (tcu::TestCaseGroup* textureTests)
{
	tcu::TestContext&	testCtx	= textureTests->getTestContext();

	textureTests->addChild(createTextureFilteringTests			(testCtx));
	textureTests->addChild(createTextureMipmappingTests			(testCtx));
	textureTests->addChild(createExplicitLodTests				(testCtx));
	textureTests->addChild(createTextureShadowTests				(testCtx));
	textureTests->addChild(createFilteringAnisotropyTests		(testCtx));
	textureTests->addChild(createTextureCompressedFormatTests	(testCtx));
}